

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O1

int do_exec(int nargs,char **args)

{
  int iVar1;
  __pid_t __pid;
  uint uVar2;
  int status;
  undefined8 local_128;
  
  iVar1 = strcmp(args[(long)nargs + -1],"&");
  __pid = fork();
  if (__pid != 0) {
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      waitpid(__pid,(int *)&local_128,0);
      uVar2 = 1;
      if (((uint)local_128 & 0x7f) == 0) {
        uVar2 = (uint)local_128 >> 8 & 0xff;
      }
    }
    return uVar2;
  }
  memset(&local_128,0,0x100);
  memcpy(&local_128,args + 1,(long)(int)((-1 - (uint)(iVar1 == 0)) + nargs) << 3);
  iVar1 = execv((char *)CONCAT44(local_128._4_4_,(uint)local_128),(char **)&local_128);
  _exit(iVar1);
}

Assistant:

int do_exec(int nargs, char **args)
{
    int ret, status, background = 0;
    char *ptrs[32];

    if(!strcmp(args[nargs-1], "&")) {
        background = 1;
        --nargs;
    }
    ret = fork();
    if (ret) {
        if (!background) {
            waitpid(ret, &status, 0);
            if (WIFEXITED(status))
                return WEXITSTATUS(status);
            else
               return 1;
        }
        return 0;
    }

    memset(ptrs, 0, sizeof(ptrs));
    memcpy(ptrs, &args[1], (nargs-1)*sizeof(char*));
    ret = execv(ptrs[0], ptrs);
    _exit(ret);
}